

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O0

Property * __thiscall
Rml::ElementAnimation::UpdateAndGetProperty
          (Property *__return_storage_ptr__,ElementAnimation *this,double world_time,
          Element *element)

{
  Element *element_00;
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  float alpha_00;
  int local_34;
  float alpha;
  int key1;
  int key0;
  float dt;
  Element *element_local;
  double world_time_local;
  ElementAnimation *this_local;
  Property *result;
  
  key1 = (int)(float)(world_time - this->last_update_world_time);
  _key0 = element;
  element_local = (Element *)world_time;
  world_time_local = (double)this;
  this_local = (ElementAnimation *)__return_storage_ptr__;
  sVar1 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::size(&this->keys);
  if (((sVar1 < 2) || ((this->animation_complete & 1U) != 0)) || ((float)key1 <= 0.0)) {
    Property::Property(__return_storage_ptr__);
  }
  else {
    key1 = (int)Math::Min<float>((float)key1,0.1);
    this->last_update_world_time = (double)element_local;
    this->time_since_iteration_start = (float)key1 + this->time_since_iteration_start;
    if (this->duration <= this->time_since_iteration_start) {
      this->current_iteration = this->current_iteration + 1;
      if ((this->num_iterations == -1) ||
         ((-1 < this->current_iteration && (this->current_iteration < this->num_iterations)))) {
        this->time_since_iteration_start = this->time_since_iteration_start - this->duration;
        if ((this->alternate_direction & 1U) != 0) {
          this->reverse_direction = (bool)((this->reverse_direction ^ 0xffU) & 1);
        }
      }
      else {
        this->animation_complete = true;
        this->time_since_iteration_start = this->duration;
      }
    }
    alpha = -NAN;
    local_34 = -1;
    alpha_00 = GetInterpolationFactorAndKeys(this,(int *)&alpha,&local_34);
    pvVar2 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::operator[]
                       (&this->keys,(long)(int)alpha);
    pvVar3 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::operator[]
                       (&this->keys,(long)local_34);
    element_00 = _key0;
    pvVar4 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::operator[]
                       (&this->keys,0);
    InterpolateProperties
              (__return_storage_ptr__,&pvVar2->property,&pvVar3->property,alpha_00,element_00,
               (pvVar4->property).definition);
  }
  return __return_storage_ptr__;
}

Assistant:

Property ElementAnimation::UpdateAndGetProperty(double world_time, Element& element)
{
	float dt = float(world_time - last_update_world_time);
	if (keys.size() < 2 || animation_complete || dt <= 0.0f)
		return Property{};

	dt = Math::Min(dt, 0.1f);

	last_update_world_time = world_time;
	time_since_iteration_start += dt;

	if (time_since_iteration_start >= duration)
	{
		// Next iteration
		current_iteration += 1;

		if (num_iterations == -1 || (current_iteration >= 0 && current_iteration < num_iterations))
		{
			time_since_iteration_start -= duration;

			if (alternate_direction)
				reverse_direction = !reverse_direction;
		}
		else
		{
			animation_complete = true;
			time_since_iteration_start = duration;
		}
	}

	int key0 = -1;
	int key1 = -1;

	float alpha = GetInterpolationFactorAndKeys(&key0, &key1);

	Property result = InterpolateProperties(keys[key0].property, keys[key1].property, alpha, element, keys[0].property.definition);

	return result;
}